

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

void xmlC14NFreeCtx(xmlC14NCtxPtr ctx)

{
  xmlC14NVisibleNsStackPtr p_Var1;
  
  p_Var1 = ctx->ns_rendered;
  if (p_Var1 != (xmlC14NVisibleNsStackPtr)0x0) {
    if (p_Var1->nsTab != (xmlNsPtr *)0x0) {
      memset(p_Var1->nsTab,0,(long)p_Var1->nsMax << 3);
      (*xmlFree)(p_Var1->nsTab);
    }
    if (p_Var1->nodeTab != (xmlNodePtr *)0x0) {
      memset(p_Var1->nodeTab,0,(long)p_Var1->nsMax << 3);
      (*xmlFree)(p_Var1->nodeTab);
    }
    p_Var1->nsTab = (xmlNsPtr *)0x0;
    p_Var1->nodeTab = (xmlNodePtr *)0x0;
    p_Var1->nsCurEnd = 0;
    p_Var1->nsPrevStart = 0;
    p_Var1->nsPrevEnd = 0;
    p_Var1->nsMax = 0;
    (*xmlFree)(p_Var1);
  }
  (*xmlFree)(ctx);
  return;
}

Assistant:

static void
xmlC14NFreeCtx(xmlC14NCtxPtr ctx)
{
    if (ctx == NULL) {
        xmlC14NErrParam(ctx);
        return;
    }

    if (ctx->ns_rendered != NULL) {
        xmlC14NVisibleNsStackDestroy(ctx->ns_rendered);
    }
    xmlFree(ctx);
}